

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O3

int av1_get_frame_buffer(void *cb_priv,size_t min_size,aom_codec_frame_buffer_t *fb)

{
  undefined8 *puVar1;
  void *pvVar2;
  int iVar3;
  uint8_t *memblk;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = -1;
  if (cb_priv != (void *)0x0) {
    iVar3 = *cb_priv;
    if ((long)iVar3 < 1) {
      uVar4 = 0;
LAB_0039866e:
      if ((int)uVar4 != iVar3) {
        lVar6 = *(long *)((long)cb_priv + 8);
        uVar4 = uVar4 & 0xffffffff;
        memblk = *(uint8_t **)(lVar6 + uVar4 * 0x18);
        if (*(ulong *)(lVar6 + 8 + uVar4 * 0x18) < min_size) {
          aom_free(memblk);
          memblk = (uint8_t *)aom_calloc(1,min_size);
          lVar6 = *(long *)((long)cb_priv + 8);
          puVar1 = (undefined8 *)(lVar6 + uVar4 * 0x18);
          *puVar1 = memblk;
          if (memblk == (uint8_t *)0x0) {
            puVar1[1] = 0;
            return -1;
          }
          puVar1[1] = min_size;
        }
        pvVar2 = (void *)(lVar6 + uVar4 * 0x18);
        fb->data = memblk;
        fb->size = *(size_t *)((long)pvVar2 + 8);
        *(undefined4 *)((long)pvVar2 + 0x10) = 1;
        fb->priv = pvVar2;
        iVar7 = 0;
      }
    }
    else {
      piVar5 = (int *)(*(long *)((long)cb_priv + 8) + 0x10);
      uVar4 = 0;
      do {
        if (*piVar5 == 0) goto LAB_0039866e;
        uVar4 = uVar4 + 1;
        piVar5 = piVar5 + 6;
      } while ((long)iVar3 != uVar4);
    }
  }
  return iVar7;
}

Assistant:

int av1_get_frame_buffer(void *cb_priv, size_t min_size,
                         aom_codec_frame_buffer_t *fb) {
  int i;
  InternalFrameBufferList *const int_fb_list =
      (InternalFrameBufferList *)cb_priv;
  if (int_fb_list == NULL) return -1;

  // Find a free frame buffer.
  for (i = 0; i < int_fb_list->num_internal_frame_buffers; ++i) {
    if (!int_fb_list->int_fb[i].in_use) break;
  }

  if (i == int_fb_list->num_internal_frame_buffers) return -1;

  if (int_fb_list->int_fb[i].size < min_size) {
    aom_free(int_fb_list->int_fb[i].data);
    // The data must be zeroed to fix a valgrind error from the C loop filter
    // due to access uninitialized memory in frame border. It could be
    // skipped if border were totally removed.
    int_fb_list->int_fb[i].data = (uint8_t *)aom_calloc(1, min_size);
    if (!int_fb_list->int_fb[i].data) {
      int_fb_list->int_fb[i].size = 0;
      return -1;
    }
    int_fb_list->int_fb[i].size = min_size;
  }

  fb->data = int_fb_list->int_fb[i].data;
  fb->size = int_fb_list->int_fb[i].size;
  int_fb_list->int_fb[i].in_use = 1;

  // Set the frame buffer's private data to point at the internal frame buffer.
  fb->priv = &int_fb_list->int_fb[i];
  return 0;
}